

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

char * __thiscall
Memory::LargeHeapBlock::TryAllocFromFreeList
          (LargeHeapBlock *this,size_t size,ObjectInfoBits attributes)

{
  LargeHeapBlockFreeListEntry **ppLVar1;
  LargeHeapBlockFreeListEntry *pLVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  char *pcVar6;
  undefined6 in_register_00000012;
  LargeHeapBlockFreeListEntry **ppLVar7;
  LargeHeapBlockFreeListEntry *entry;
  
  if (0x3ff < (uint)CONCAT62(in_register_00000012,attributes)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x1dd,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  ppLVar1 = &(this->freeList).entries;
  entry = (this->freeList).entries;
  pcVar6 = (char *)0x0;
  ppLVar7 = ppLVar1;
  do {
    if (entry == (LargeHeapBlockFreeListEntry *)0x0) break;
    if (entry->objectSize < size) {
LAB_006f0e0e:
      ppLVar7 = &entry->next;
      entry = *ppLVar7;
      bVar4 = true;
    }
    else {
      pLVar2 = entry->next;
      pcVar6 = AllocFreeListEntry(entry->heapBlock,size,attributes,entry);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)0x0;
        goto LAB_006f0e0e;
      }
      *ppLVar7 = pLVar2;
      bVar4 = false;
    }
  } while (bVar4);
  if (*ppLVar1 == (LargeHeapBlockFreeListEntry *)0x0) {
    LargeHeapBucket::UnregisterFreeList(this->bucket,&this->freeList);
  }
  return pcVar6;
}

Assistant:

char*
LargeHeapBlock::TryAllocFromFreeList(DECLSPEC_GUARD_OVERFLOW size_t size, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    LargeHeapBlockFreeListEntry** prev = &this->freeList.entries;
    LargeHeapBlockFreeListEntry* freeListEntry = this->freeList.entries;

    char* memBlock = nullptr;

    // Walk through the free list, find the first entry that can fit our desired size
    while (freeListEntry)
    {
        LargeHeapBlockFreeListEntry* next = freeListEntry->next;
        LargeHeapBlock* heapBlock = freeListEntry->heapBlock;

        if (freeListEntry->objectSize >= size)
        {
            memBlock = heapBlock->AllocFreeListEntry(size, attributes, freeListEntry);
            if (memBlock)
            {
                (*prev) = next;

                break;
            }
        }

        prev = &freeListEntry->next;
        freeListEntry = freeListEntry->next;
    }

    if (this->freeList.entries == nullptr)
    {
        this->bucket->UnregisterFreeList(&this->freeList);
    }

    return memBlock;
}